

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch.c
# Opt level: O0

void find_best_pitch(opus_val32 *xcorr,opus_val16 *y,int len,int max_pitch,int *best_pitch)

{
  float fVar1;
  float local_50;
  opus_val32 xcorr16;
  opus_val16 num;
  opus_val32 best_den [2];
  opus_val16 best_num [2];
  opus_val32 Syy;
  int j;
  int i;
  int *best_pitch_local;
  int max_pitch_local;
  int len_local;
  opus_val16 *y_local;
  opus_val32 *xcorr_local;
  
  best_num[0] = 1.0;
  best_den[0] = -1.0;
  best_den[1] = -1.0;
  xcorr16 = 0.0;
  num = 0.0;
  *best_pitch = 0;
  best_pitch[1] = 1;
  for (best_num[1] = 0.0; (int)best_num[1] < len; best_num[1] = (opus_val16)((int)best_num[1] + 1))
  {
    best_num[0] = y[(int)best_num[1]] * y[(int)best_num[1]] + best_num[0];
  }
  for (Syy = 0.0; (int)Syy < max_pitch; Syy = (opus_val32)((int)Syy + 1)) {
    if ((0.0 < (float)xcorr[(int)Syy]) &&
       (fVar1 = (float)xcorr[(int)Syy] * 1e-12 * (float)xcorr[(int)Syy] * 1e-12,
       (float)best_den[1] * best_num[0] < fVar1 * num)) {
      if (fVar1 * (float)xcorr16 <= (float)best_den[0] * best_num[0]) {
        num = best_num[0];
        best_pitch[1] = (int)Syy;
        best_den[1] = (opus_val32)fVar1;
      }
      else {
        best_den[1] = best_den[0];
        num = (opus_val16)xcorr16;
        best_pitch[1] = *best_pitch;
        xcorr16 = (opus_val32)best_num[0];
        *best_pitch = (int)Syy;
        best_den[0] = (opus_val32)fVar1;
      }
    }
    local_50 = y[(int)Syy + len] * y[(int)Syy + len] + -(y[(int)Syy] * y[(int)Syy]) + best_num[0];
    if (local_50 < 1.0) {
      local_50 = 1.0;
    }
    best_num[0] = local_50;
  }
  return;
}

Assistant:

static void find_best_pitch(opus_val32 *xcorr, opus_val16 *y, int len,
                            int max_pitch, int *best_pitch
#ifdef FIXED_POINT
        , int yshift, opus_val32 maxcorr
#endif
) {
    int i, j;
    opus_val32 Syy = 1;
    opus_val16 best_num[2];
    opus_val32 best_den[2];
#ifdef FIXED_POINT
    int xshift;

    xshift = celt_ilog2(maxcorr)-14;
#endif

    best_num[0] = -1;
    best_num[1] = -1;
    best_den[0] = 0;
    best_den[1] = 0;
    best_pitch[0] = 0;
    best_pitch[1] = 1;
    for (j = 0; j < len; j++)
        Syy = ADD32(Syy, SHR32(MULT16_16(y[j], y[j]), yshift));
    for (i = 0; i < max_pitch; i++) {
        if (xcorr[i] > 0) {
            opus_val16 num;
            opus_val32 xcorr16;
            xcorr16 = EXTRACT16(VSHR32(xcorr[i], xshift));
#ifndef FIXED_POINT
            /* Considering the range of xcorr16, this should avoid both underflows
               and overflows (inf) when squaring xcorr16 */
            xcorr16 *= 1e-12f;
#endif
            num = MULT16_16_Q15(xcorr16, xcorr16);
            if (MULT16_32_Q15(num, best_den[1]) > MULT16_32_Q15(best_num[1], Syy)) {
                if (MULT16_32_Q15(num, best_den[0]) > MULT16_32_Q15(best_num[0], Syy)) {
                    best_num[1] = best_num[0];
                    best_den[1] = best_den[0];
                    best_pitch[1] = best_pitch[0];
                    best_num[0] = num;
                    best_den[0] = Syy;
                    best_pitch[0] = i;
                } else {
                    best_num[1] = num;
                    best_den[1] = Syy;
                    best_pitch[1] = i;
                }
            }
        }
        Syy += SHR32(MULT16_16(y[i + len], y[i + len]), yshift) - SHR32(MULT16_16(y[i], y[i]), yshift);
        Syy = MAX32(1, Syy);
    }
}